

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_getParameterValueOfObjectTypeWithoutComparator_Test::testBody
          (TEST_MockExpectedCall_getParameterValueOfObjectTypeWithoutComparator_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  TypeForTestingExpectedFunctionCall type;
  MockNamedValueComparatorsAndCopiersRepository repository;
  SimpleString local_58;
  SimpleString local_48;
  undefined **local_38;
  undefined4 *local_30;
  MockNamedValueComparatorsAndCopiersRepository local_28;
  
  local_38 = &PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  local_30 = (undefined4 *)
             operator_new(4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                          ,0x26);
  *local_30 = 1;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&local_28);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository(&local_28);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_48,"type");
  SimpleString::SimpleString(&local_58,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])
            (pMVar1,&local_48,&local_58,&local_38);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_58,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x29])(&local_48,pMVar1,&local_58);
  pcVar3 = SimpleString::asCharString(&local_48);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"No comparator found for type: \"type\"",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x19f,pTVar4);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_58);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&local_28);
  local_38 = &PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  operator_delete(local_30,4);
  return;
}

Assistant:

TEST(MockExpectedCall, getParameterValueOfObjectTypeWithoutComparator)
{
    TypeForTestingExpectedFunctionCall type(1);
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    call->withParameterOfType("type", "name", &type);
    STRCMP_EQUAL("No comparator found for type: \"type\"", call->getInputParameterValueString("name").asCharString());
}